

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install_info.cpp
# Opt level: O3

ExtensionRepository *
duckdb::ExtensionRepository::GetRepositoryByUrl
          (ExtensionRepository *__return_storage_ptr__,string *url)

{
  string repo_name;
  string local_38;
  
  if (url->_M_string_length == 0) {
    GetCoreRepository();
  }
  else {
    TryConvertUrlToKnownRepository(&local_38,url);
    ExtensionRepository(__return_storage_ptr__,&local_38,url);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ExtensionRepository ExtensionRepository::GetRepositoryByUrl(const string &url) {
	if (url.empty()) {
		return GetCoreRepository();
	}

	auto repo_name = TryConvertUrlToKnownRepository(url);
	return {repo_name, url};
}